

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::Statement> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Statement>(RecursiveDescentParser *this)

{
  istream *piVar1;
  int iVar2;
  socklen_t *in_RCX;
  istream *piVar3;
  sockaddr *__addr;
  sockaddr *__addr_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  sockaddr *__addr_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  sockaddr *__addr_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Statement> sVar5;
  allocator local_51;
  string local_50;
  
  sVar5 = std::make_shared<MyCompiler::Statement>();
  if (in_RSI->sym == IDENT) {
    *(undefined4 *)(this->stream + 4) = 0;
    parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_50);
    std::__shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2> *)(this->stream + 0x48),
               (__shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
    std::__cxx11::string::string((string *)&local_50,"assignment operator expected",&local_51);
    except(in_RSI,BECOMES,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    parse<MyCompiler::Expression>((RecursiveDescentParser *)&local_50);
    std::__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)
               (this->stream + 0x58),
               (__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  }
  else {
    iVar2 = accept(in_RSI,0x15,
                   (sockaddr *)
                   sVar5.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi,in_RCX);
    if ((char)iVar2 == '\0') {
      iVar2 = accept(in_RSI,0x17,__addr,in_RCX);
      if ((char)iVar2 == '\0') {
        iVar2 = accept(in_RSI,0x1b,__addr_00,in_RCX);
        if ((char)iVar2 == '\0') {
          iVar2 = accept(in_RSI,0x19,__addr_01,in_RCX);
          if ((char)iVar2 == '\0') {
            iVar2 = accept(in_RSI,0x18,__addr_02,in_RCX);
            if ((char)iVar2 == '\0') {
              iVar2 = accept(in_RSI,0x13,__addr_04,in_RCX);
              piVar3 = this->stream;
              if ((char)iVar2 == '\0') {
                *(socklen_t *)(piVar3 + 4) = 7;
                _Var4._M_pi = extraout_RDX_00;
                goto LAB_00104346;
              }
              *(socklen_t *)(piVar3 + 4) = 6;
              do {
                piVar1 = this->stream;
                parse<MyCompiler::Statement>((RecursiveDescentParser *)&local_50);
                std::vector<MyCompiler::Statement,_std::allocator<MyCompiler::Statement>_>::
                push_back((vector<MyCompiler::Statement,_std::allocator<MyCompiler::Statement>_> *)
                          (piVar1 + 0xa0),(value_type *)local_50._M_dataplus._M_p);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length)
                ;
                iVar2 = accept(in_RSI,0x10,__addr_06,(socklen_t *)piVar3);
              } while ((char)iVar2 != '\0');
              std::__cxx11::string::string
                        ((string *)&local_50,"semicolon or end expected",&local_51);
              except(in_RSI,END,&local_50);
            }
            else {
              *(undefined4 *)(this->stream + 4) = 5;
              std::__cxx11::string::string
                        ((string *)&local_50,"left parenthesis expected",&local_51);
              except(in_RSI,LPAREN,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              do {
                piVar3 = this->stream;
                parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_50);
                std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::push_back
                          ((vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_> *)
                           (piVar3 + 0x88),(value_type *)local_50._M_dataplus._M_p);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length)
                ;
                iVar2 = accept(in_RSI,0xf,__addr_05,in_RCX);
              } while ((char)iVar2 != '\0');
              std::__cxx11::string::string
                        ((string *)&local_50,"right parenthesis expected",&local_51);
              except(in_RSI,RPAREN,&local_50);
            }
          }
          else {
            *(undefined4 *)(this->stream + 4) = 4;
            std::__cxx11::string::string((string *)&local_50,"left parenthesis expected",&local_51);
            except(in_RSI,LPAREN,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            do {
              piVar3 = this->stream;
              parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_50);
              std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::push_back
                        ((vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_> *)
                         (piVar3 + 0x88),(value_type *)local_50._M_dataplus._M_p);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
              iVar2 = accept(in_RSI,0xf,__addr_03,in_RCX);
            } while ((char)iVar2 != '\0');
            std::__cxx11::string::string((string *)&local_50,"right parenthesis expected",&local_51)
            ;
            except(in_RSI,RPAREN,&local_50);
          }
          std::__cxx11::string::~string((string *)&local_50);
          _Var4._M_pi = extraout_RDX_01;
          goto LAB_00104346;
        }
        *(undefined4 *)(this->stream + 4) = 3;
        parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_50);
        std::__shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2> *)
                   (this->stream + 0x48),
                   (__shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
        goto LAB_0010433c;
      }
      *(undefined4 *)(this->stream + 4) = 2;
      parse<MyCompiler::Condition>((RecursiveDescentParser *)&local_50);
      std::__shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2> *)
                 (this->stream + 0x68),
                 (__shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      std::__cxx11::string::string((string *)&local_50,"do expected",&local_51);
      except(in_RSI,DO,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      parse<MyCompiler::Statement>((RecursiveDescentParser *)&local_50);
    }
    else {
      *(undefined4 *)(this->stream + 4) = 1;
      parse<MyCompiler::Condition>((RecursiveDescentParser *)&local_50);
      std::__shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2> *)
                 (this->stream + 0x68),
                 (__shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      std::__cxx11::string::string((string *)&local_50,"then expected",&local_51);
      except(in_RSI,THEN,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      parse<MyCompiler::Statement>((RecursiveDescentParser *)&local_50);
    }
    std::__shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2> *)
               (this->stream + 0x78),
               (__shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  }
LAB_0010433c:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  _Var4._M_pi = extraout_RDX;
LAB_00104346:
  sVar5.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Statement>)
         sVar5.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Statement> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Statement>();

    if (sym == SymbolType::IDENT)
    {
        pResult->caseNum = 0;
        pResult->pIdent = parse<Ident>();
        except(SymbolType::BECOMES, "assignment operator expected");
        pResult->pExpression = parse<Expression>();
    }
    else if (accept(SymbolType::IF))
    {
        pResult->caseNum = 1;
        pResult->pCondition = parse<Condition>();
        except(SymbolType::THEN, "then expected");
        pResult->pStatement = parse<Statement>();
    }
    else if (accept(SymbolType::WHILE))
    {
        pResult->caseNum = 2;
        pResult->pCondition = parse<Condition>();
        except(SymbolType::DO, "do expected");
        pResult->pStatement = parse<Statement>();
    }
    else if (accept(SymbolType::CALL))
    {
        pResult->caseNum = 3;
        pResult->pIdent = parse<Ident>();
    }
    else if (accept(SymbolType::READ))
    {
        pResult->caseNum = 4;
        except(SymbolType::LPAREN, "left parenthesis expected");
        do
            pResult->vIdent.push_back(*parse<Ident>());
        while (accept(SymbolType::COMMA));
        except(SymbolType::RPAREN, "right parenthesis expected");
    }
    else if (accept(SymbolType::WRITE))
    {
        pResult->caseNum = 5;
        except(SymbolType::LPAREN, "left parenthesis expected");
        do
            pResult->vIdent.push_back(*parse<Ident>());
        while (accept(SymbolType::COMMA));
        except(SymbolType::RPAREN, "right parenthesis expected");
    }
    else if (accept(SymbolType::BEGIN))
    {
        pResult->caseNum = 6;
        do
            pResult->vStatement.push_back(*parse<Statement>());
        while (accept(SymbolType::SEMICOLON));
        except(SymbolType::END, "semicolon or end expected");
    }
    else
        pResult->caseNum = 7;

    return pResult;
}